

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fflush.c
# Opt level: O0

int fflush(FILE *__stream)

{
  int iVar1;
  int local_14;
  _PDCLIB_file_t *p_Stack_10;
  int rc;
  _PDCLIB_file_t *stream_local;
  
  local_14 = 0;
  if (__stream == (FILE *)0x0) {
    mtx_lock(&_PDCLIB_filelist_mtx);
    for (p_Stack_10 = _PDCLIB_filelist; p_Stack_10 != (_PDCLIB_file_t *)0x0;
        p_Stack_10 = p_Stack_10->next) {
      mtx_lock(&p_Stack_10->mtx);
      if (((p_Stack_10->status & 0x10) != 0) &&
         (iVar1 = _PDCLIB_flushbuffer(p_Stack_10), iVar1 == -1)) {
        local_14 = -1;
      }
      mtx_unlock(&p_Stack_10->mtx);
    }
    mtx_unlock(&_PDCLIB_filelist_mtx);
  }
  else {
    mtx_lock((mtx_t *)&__stream->_IO_save_base);
    local_14 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream);
    mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  }
  return local_14;
}

Assistant:

int fflush( struct _PDCLIB_file_t * stream )
{
    int rc = 0;

    if ( stream == NULL )
    {
        _PDCLIB_LOCK( _PDCLIB_filelist_mtx );
        stream = _PDCLIB_filelist;

        /* TODO: Check what happens when fflush( NULL ) encounters write errors, in other libs */
        while ( stream != NULL )
        {
            _PDCLIB_LOCK( stream->mtx );

            if ( stream->status & _PDCLIB_FWRITE )
            {
                if ( _PDCLIB_flushbuffer( stream ) == EOF )
                {
                    rc = EOF;
                }
            }

            _PDCLIB_UNLOCK( stream->mtx );

            stream = stream->next;
        }

        _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
    }
    else
    {
        _PDCLIB_LOCK( stream->mtx );
        rc = _PDCLIB_flushbuffer( stream );
        _PDCLIB_UNLOCK( stream->mtx );
    }

    return rc;
}